

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O2

void Eigen::internal::
     general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<double,_long,_1> *alhs,
          const_blas_data_mapper<double,_long,_0> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  
  pdVar11 = (alhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data;
  lVar2 = (alhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
  pdVar12 = pdVar11 + lVar2;
  pdVar6 = pdVar11 + lVar2 * 3;
  pdVar7 = pdVar11 + lVar2 * 2;
  for (uVar9 = 0; ((ulong)(lVar2 * 8) < 0x7d01 && ((long)uVar9 < rows + -7)); uVar9 = uVar9 + 8) {
    pdVar13 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
    dVar24 = 0.0;
    dVar25 = 0.0;
    dVar16 = 0.0;
    dVar17 = 0.0;
    dVar26 = 0.0;
    dVar27 = 0.0;
    dVar18 = 0.0;
    dVar19 = 0.0;
    dVar28 = 0.0;
    dVar29 = 0.0;
    dVar20 = 0.0;
    dVar21 = 0.0;
    dVar30 = 0.0;
    dVar31 = 0.0;
    dVar22 = 0.0;
    dVar23 = 0.0;
    pdVar5 = pdVar11;
    lVar8 = 0;
    while (lVar8 + 2 <= cols) {
      pdVar10 = pdVar13 + lVar8;
      dVar3 = *pdVar10;
      dVar4 = pdVar10[1];
      dVar22 = dVar22 + pdVar11[lVar8] * dVar3;
      dVar23 = dVar23 + (pdVar11 + lVar8)[1] * dVar4;
      dVar30 = dVar30 + pdVar11[lVar8 + lVar2] * dVar3;
      dVar31 = dVar31 + (pdVar11 + lVar8 + lVar2)[1] * dVar4;
      dVar20 = dVar20 + pdVar11[lVar8 + lVar2 * 2] * dVar3;
      dVar21 = dVar21 + (pdVar11 + lVar8 + lVar2 * 2)[1] * dVar4;
      dVar28 = dVar28 + pdVar11[lVar8 + lVar2 * 3] * dVar3;
      dVar29 = dVar29 + (pdVar11 + lVar8 + lVar2 * 3)[1] * dVar4;
      dVar18 = dVar18 + pdVar11[lVar8 + lVar2 * 4] * dVar3;
      dVar19 = dVar19 + (pdVar11 + lVar8 + lVar2 * 4)[1] * dVar4;
      dVar26 = dVar26 + pdVar11[lVar8 + lVar2 * 5] * dVar3;
      dVar27 = dVar27 + (pdVar11 + lVar8 + lVar2 * 5)[1] * dVar4;
      dVar16 = dVar16 + pdVar11[lVar8 + lVar2 * 6] * dVar3;
      dVar17 = dVar17 + (pdVar11 + lVar8 + lVar2 * 6)[1] * dVar4;
      dVar24 = dVar24 + pdVar11[lVar8 + lVar2 * 7] * dVar3;
      dVar25 = dVar25 + (pdVar11 + lVar8 + lVar2 * 7)[1] * dVar4;
      pdVar5 = pdVar5 + 2;
      lVar8 = lVar8 + 2;
    }
    dVar23 = dVar23 + dVar22;
    dVar31 = dVar31 + dVar30;
    dVar21 = dVar21 + dVar20;
    dVar29 = dVar29 + dVar28;
    dVar19 = dVar19 + dVar18;
    dVar27 = dVar27 + dVar26;
    dVar17 = dVar17 + dVar16;
    dVar25 = dVar25 + dVar24;
    for (; lVar8 < cols; lVar8 = lVar8 + 1) {
      dVar16 = pdVar13[lVar8];
      dVar23 = dVar23 + *pdVar5 * dVar16;
      dVar31 = dVar31 + pdVar5[lVar2] * dVar16;
      dVar21 = dVar21 + pdVar5[lVar2 * 2] * dVar16;
      dVar29 = dVar29 + pdVar5[lVar2 * 3] * dVar16;
      dVar19 = dVar19 + pdVar5[lVar2 * 4] * dVar16;
      dVar27 = dVar27 + pdVar5[lVar2 * 5] * dVar16;
      dVar17 = dVar17 + pdVar5[lVar2 * 6] * dVar16;
      dVar25 = dVar25 + pdVar5[lVar2 * 7] * dVar16;
      pdVar5 = pdVar5 + 1;
    }
    res[uVar9 * resIncr] = alpha * dVar23 + res[uVar9 * resIncr];
    lVar8 = (uVar9 | 1) * resIncr;
    res[lVar8] = dVar31 * alpha + res[lVar8];
    lVar8 = (uVar9 | 2) * resIncr;
    res[lVar8] = alpha * dVar21 + res[lVar8];
    lVar8 = (uVar9 | 3) * resIncr;
    res[lVar8] = dVar29 * alpha + res[lVar8];
    lVar8 = (uVar9 | 4) * resIncr;
    res[lVar8] = alpha * dVar19 + res[lVar8];
    lVar8 = (uVar9 | 5) * resIncr;
    res[lVar8] = dVar27 * alpha + res[lVar8];
    lVar8 = (uVar9 | 6) * resIncr;
    res[lVar8] = alpha * dVar17 + res[lVar8];
    lVar8 = (uVar9 | 7) * resIncr;
    res[lVar8] = dVar25 * alpha + res[lVar8];
    pdVar11 = pdVar11 + lVar2 * 8;
    pdVar12 = pdVar12 + lVar2 * 8;
    pdVar6 = pdVar6 + lVar2 * 8;
    pdVar7 = pdVar7 + lVar2 * 8;
  }
  for (; (long)uVar9 < rows + -3; uVar9 = uVar9 + 4) {
    pdVar13 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
    dVar20 = 0.0;
    dVar25 = 0.0;
    dVar16 = 0.0;
    dVar17 = 0.0;
    dVar21 = 0.0;
    dVar27 = 0.0;
    dVar18 = 0.0;
    dVar19 = 0.0;
    lVar8 = 0;
    pdVar5 = pdVar6;
    pdVar10 = pdVar11;
    pdVar14 = pdVar7;
    pdVar15 = pdVar12;
    while (lVar8 + 2 <= cols) {
      pdVar1 = pdVar13 + lVar8;
      dVar29 = *pdVar1;
      dVar22 = pdVar1[1];
      dVar18 = dVar18 + pdVar11[lVar8] * dVar29;
      dVar19 = dVar19 + (pdVar11 + lVar8)[1] * dVar22;
      dVar21 = dVar21 + pdVar12[lVar8] * dVar29;
      dVar27 = dVar27 + (pdVar12 + lVar8)[1] * dVar22;
      dVar16 = dVar16 + pdVar7[lVar8] * dVar29;
      dVar17 = dVar17 + (pdVar7 + lVar8)[1] * dVar22;
      dVar20 = dVar20 + pdVar6[lVar8] * dVar29;
      dVar25 = dVar25 + (pdVar6 + lVar8)[1] * dVar22;
      pdVar10 = pdVar10 + 2;
      pdVar15 = pdVar15 + 2;
      pdVar14 = pdVar14 + 2;
      pdVar5 = pdVar5 + 2;
      lVar8 = lVar8 + 2;
    }
    dVar19 = dVar19 + dVar18;
    dVar27 = dVar27 + dVar21;
    dVar17 = dVar17 + dVar16;
    dVar25 = dVar25 + dVar20;
    for (; lVar8 < cols; lVar8 = lVar8 + 1) {
      dVar16 = pdVar13[lVar8];
      dVar17 = dVar17 + *pdVar14 * dVar16;
      dVar25 = dVar25 + *pdVar5 * dVar16;
      dVar19 = dVar19 + *pdVar10 * dVar16;
      dVar27 = dVar27 + *pdVar15 * dVar16;
      pdVar10 = pdVar10 + 1;
      pdVar15 = pdVar15 + 1;
      pdVar14 = pdVar14 + 1;
      pdVar5 = pdVar5 + 1;
    }
    res[uVar9 * resIncr] = alpha * dVar19 + res[uVar9 * resIncr];
    lVar8 = (uVar9 | 1) * resIncr;
    res[lVar8] = dVar27 * alpha + res[lVar8];
    lVar8 = (uVar9 | 2) * resIncr;
    res[lVar8] = alpha * dVar17 + res[lVar8];
    lVar8 = (uVar9 | 3) * resIncr;
    res[lVar8] = dVar25 * alpha + res[lVar8];
    pdVar11 = pdVar11 + lVar2 * 4;
    pdVar12 = pdVar12 + lVar2 * 4;
    pdVar6 = pdVar6 + lVar2 * 4;
    pdVar7 = pdVar7 + lVar2 * 4;
  }
  for (; (long)uVar9 < rows + -1; uVar9 = uVar9 + 2) {
    pdVar7 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
    dVar16 = 0.0;
    dVar17 = 0.0;
    dVar18 = 0.0;
    dVar25 = 0.0;
    pdVar6 = pdVar11;
    pdVar13 = pdVar12;
    lVar8 = 0;
    while (lVar8 + 2 <= cols) {
      pdVar5 = pdVar7 + lVar8;
      dVar19 = *pdVar5;
      dVar27 = pdVar5[1];
      dVar16 = dVar16 + pdVar11[lVar8] * dVar19;
      dVar17 = dVar17 + (pdVar11 + lVar8)[1] * dVar27;
      dVar18 = dVar18 + pdVar12[lVar8] * dVar19;
      dVar25 = dVar25 + (pdVar12 + lVar8)[1] * dVar27;
      pdVar6 = pdVar6 + 2;
      pdVar13 = pdVar13 + 2;
      lVar8 = lVar8 + 2;
    }
    dVar17 = dVar17 + dVar16;
    dVar25 = dVar25 + dVar18;
    for (; lVar8 < cols; lVar8 = lVar8 + 1) {
      dVar16 = pdVar7[lVar8];
      dVar17 = dVar17 + *pdVar6 * dVar16;
      dVar25 = dVar25 + *pdVar13 * dVar16;
      pdVar6 = pdVar6 + 1;
      pdVar13 = pdVar13 + 1;
    }
    res[uVar9 * resIncr] = alpha * dVar17 + res[uVar9 * resIncr];
    lVar8 = (uVar9 | 1) * resIncr;
    res[lVar8] = dVar25 * alpha + res[lVar8];
    pdVar11 = pdVar11 + lVar2 * 2;
    pdVar12 = pdVar12 + lVar2 * 2;
  }
  for (; (long)uVar9 < rows; uVar9 = uVar9 + 1) {
    pdVar12 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
    dVar17 = 0.0;
    dVar16 = 0.0;
    pdVar7 = pdVar11;
    lVar8 = 0;
    while (lVar8 + 2 <= cols) {
      pdVar6 = pdVar12 + lVar8;
      dVar17 = dVar17 + pdVar11[lVar8] * *pdVar6;
      dVar16 = dVar16 + (pdVar11 + lVar8)[1] * pdVar6[1];
      pdVar7 = pdVar7 + 2;
      lVar8 = lVar8 + 2;
    }
    dVar16 = dVar16 + dVar17;
    for (; lVar8 < cols; lVar8 = lVar8 + 1) {
      dVar16 = dVar16 + *pdVar7 * pdVar12[lVar8];
      pdVar7 = pdVar7 + 1;
    }
    res[uVar9 * resIncr] = dVar16 * alpha + res[uVar9 * resIncr];
    pdVar11 = pdVar11 + lVar2;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}